

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaPrs.h
# Opt level: O0

Prs_Man_t * Prs_ManAlloc(char *pFileName)

{
  Abc_Nam_t *pAVar1;
  Hash_IntMan_t *pHVar2;
  Vec_Ptr_t *pVVar3;
  char *local_30;
  char *pLimit;
  char *pBuffer;
  Prs_Man_t *p;
  char *pFileName_local;
  
  p = (Prs_Man_t *)pFileName;
  pBuffer = (char *)calloc(1,0x4c0);
  if (p != (Prs_Man_t *)0x0) {
    pLimit = Prs_ManLoadFile((char *)p,&local_30);
    if (pLimit == (char *)0x0) {
      return (Prs_Man_t *)0x0;
    }
    *(Prs_Man_t **)pBuffer = p;
    *(char **)(pBuffer + 8) = pLimit;
    *(char **)(pBuffer + 0x10) = local_30;
    *(char **)(pBuffer + 0x18) = pLimit;
  }
  pAVar1 = Abc_NamStart(1000,0x18);
  *(Abc_Nam_t **)(pBuffer + 0x20) = pAVar1;
  pAVar1 = Abc_NamStart(100,0x18);
  *(Abc_Nam_t **)(pBuffer + 0x28) = pAVar1;
  pHVar2 = Hash_IntManStart(1000);
  *(Hash_IntMan_t **)(pBuffer + 0x30) = pHVar2;
  pVVar3 = Vec_PtrAlloc(100);
  *(Vec_Ptr_t **)(pBuffer + 0x40) = pVVar3;
  return (Prs_Man_t *)pBuffer;
}

Assistant:

static inline Prs_Man_t * Prs_ManAlloc( char * pFileName )
{
    Prs_Man_t * p;
    p = ABC_CALLOC( Prs_Man_t, 1 );
    if ( pFileName )
    {
        char * pBuffer, * pLimit;
        pBuffer = Prs_ManLoadFile( pFileName, &pLimit );
        if ( pBuffer == NULL )
            return NULL;
        p->pName   = pFileName;
        p->pBuffer = pBuffer;
        p->pLimit  = pLimit;
        p->pCur    = pBuffer;
    }
    p->pStrs = Abc_NamStart( 1000, 24 );
    p->pFuns = Abc_NamStart( 100, 24 );
    p->vHash = Hash_IntManStart( 1000 );
    p->vNtks = Vec_PtrAlloc( 100 );
    return p;
}